

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  uint uVar3;
  exr_coding_channel_info_t *peVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint8_t *puVar11;
  ulong uVar12;
  long lVar13;
  uint8_t *cdata;
  float *pfVar14;
  int32_t *piVar15;
  uint uVar16;
  void *pvVar17;
  bool bVar18;
  float fVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  ushort uVar23;
  uint uVar24;
  float fVar25;
  int iVar26;
  long local_78;
  
  lVar8 = (long)(decode->chunk).height;
  if (0 < lVar8) {
    uVar3 = (decode->chunk).width;
    pvVar17 = decode->unpacked_buffer;
    piVar15 = decode->sample_count_table;
    local_78 = 0;
    do {
      bVar18 = 0 < decode->channel_count;
      if (0 < decode->channel_count) {
        peVar4 = decode->channels;
        lVar13 = 0;
        do {
          cVar1 = peVar4[lVar13].bytes_per_element;
          if (peVar4[lVar13].field_12.decode_to_ptr == (uint8_t *)0x0) {
            if ((decode->decode_flags & 1) == 0) {
              iVar7 = piVar15[(long)(int)uVar3 + -1];
            }
            else if ((int)uVar3 < 1) {
              iVar7 = 0;
            }
            else {
              uVar12 = 0;
              iVar7 = 0;
              do {
                iVar7 = iVar7 + piVar15[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar3 != uVar12);
            }
            pvVar17 = (void *)((long)pvVar17 + (long)iVar7 * (long)(int)cVar1);
            iVar7 = 7;
          }
          else if ((int)uVar3 < 1) {
            iVar7 = 0;
          }
          else {
            lVar9 = (long)peVar4[lVar13].user_bytes_per_element;
            iVar7 = peVar4[lVar13].user_pixel_stride;
            puVar11 = peVar4[lVar13].field_12.decode_to_ptr +
                      ((ulong)(long)peVar4[lVar13].user_line_stride >> 3) * local_78 * 8;
            uVar12 = 0;
            iVar26 = 0;
            do {
              pfVar14 = *(float **)puVar11;
              iVar20 = iVar26;
              iVar10 = piVar15[uVar12];
              if ((decode->decode_flags & 1) != 0) {
                iVar20 = 0;
                iVar10 = iVar26;
              }
              iVar26 = iVar10;
              iVar20 = piVar15[uVar12] - iVar20;
              if (pfVar14 == (float *)0x0) {
LAB_00127388:
                pvVar17 = (void *)((long)pvVar17 + (long)(iVar20 * cVar1));
                bVar6 = true;
              }
              else {
                uVar2 = peVar4[lVar13].data_type;
                if (uVar2 == 0) {
                  uVar2 = peVar4[lVar13].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        *pfVar14 = (float)*(uint *)((long)pvVar17 + lVar21 * 4);
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        uVar16 = *(uint *)((long)pvVar17 + lVar21 * 4);
                        uVar23 = 0x7c00;
                        if (uVar16 < 0xffe1) {
                          fVar25 = (float)(int)uVar16;
                          if ((uint)fVar25 < 0x38800000) {
                            if ((uint)fVar25 < 0x33000001) {
                              uVar23 = 0;
                            }
                            else {
                              cVar5 = (char)((uint)fVar25 >> 0x17);
                              uVar16 = (uint)fVar25 & 0x7fffff | 0x800000;
                              uVar23 = (ushort)(uVar16 >> (0x7eU - cVar5 & 0x1f));
                              if (0x80000000 < uVar16 << (cVar5 + 0xa2U & 0x1f)) {
                                uVar23 = uVar23 + 1;
                              }
                            }
                          }
                          else if ((uint)fVar25 < 0x7f800000) {
                            if ((uint)fVar25 < 0x477ff000) {
                              uVar23 = (ushort)((int)fVar25 + 0x8000fff +
                                                (uint)(((uint)fVar25 >> 0xd & 1) != 0) >> 0xd);
                            }
                          }
                          else if (fVar25 != INFINITY) {
                            uVar16 = (uint)fVar25 >> 0xd & 0x3ff;
                            uVar23 = (ushort)(uVar16 == 0) | (ushort)uVar16 | 0x7c00;
                          }
                        }
                        *(ushort *)pfVar14 = uVar23;
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  else {
                    if (uVar2 != 0) goto LAB_001270b3;
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        *pfVar14 = *(float *)((long)pvVar17 + lVar21 * 4);
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  goto LAB_00127388;
                }
                if (uVar2 == 2) {
                  uVar2 = peVar4[lVar13].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        *pfVar14 = *(float *)((long)pvVar17 + lVar21 * 4);
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        uVar16 = *(uint *)((long)pvVar17 + lVar21 * 4);
                        uVar24 = uVar16 & 0x7fffffff;
                        uVar23 = (ushort)(uVar16 >> 0x10) & 0x8000;
                        if (uVar24 < 0x38800000) {
                          if ((0x33000000 < uVar24) &&
                             (uVar16 = uVar16 & 0x7fffff | 0x800000, cVar5 = (char)(uVar24 >> 0x17),
                             uVar23 = uVar23 | (ushort)(uVar16 >> (0x7eU - cVar5 & 0x1f)),
                             0x80000000 < uVar16 << (cVar5 + 0xa2U & 0x1f))) {
                            uVar23 = uVar23 + 1;
                          }
                        }
                        else if (uVar24 < 0x7f800000) {
                          if (uVar24 < 0x477ff000) {
                            uVar23 = (ushort)(uVar24 + 0x8000fff + (uint)((uVar24 >> 0xd & 1) != 0)
                                             >> 0xd) | uVar23;
                          }
                          else {
                            uVar23 = uVar23 | 0x7c00;
                          }
                        }
                        else {
                          uVar23 = uVar23 | 0x7c00;
                          if (uVar24 != 0x7f800000) {
                            uVar16 = uVar24 >> 0xd & 0x3ff;
                            uVar23 = uVar23 | (ushort)uVar16 | (ushort)(uVar16 == 0);
                          }
                        }
                        *(ushort *)pfVar14 = uVar23;
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  else {
                    if (uVar2 != 0) goto LAB_001270b3;
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        fVar25 = *(float *)((long)pvVar17 + lVar21 * 4);
                        fVar19 = 0.0;
                        if (0.0 <= fVar25) {
                          fVar19 = (float)(long)fVar25;
                          if (ABS(fVar25) == INFINITY) {
                            fVar19 = -NAN;
                          }
                          if (4.2949673e+09 < fVar25) {
                            fVar19 = -NAN;
                          }
                        }
                        *pfVar14 = fVar19;
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  goto LAB_00127388;
                }
                if (uVar2 == 1) {
                  uVar2 = peVar4[lVar13].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        uVar24 = (uint)*(short *)((long)pvVar17 + lVar21 * 2);
                        uVar16 = uVar24 & 0x7fff;
                        uVar22 = uVar16 << 0xd;
                        fVar25 = (float)(uVar24 & 0x80000000);
                        if (uVar22 < 0x800000) {
                          if (uVar16 != 0) {
                            uVar24 = 0x1f;
                            if (uVar16 != 0) {
                              for (; uVar22 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                              }
                            }
                            iVar10 = (uVar24 ^ 0x1f) - 8;
                            fVar25 = (float)(((uint)fVar25 | uVar22 << ((byte)iVar10 & 0x1f) |
                                             0x38800000) + iVar10 * -0x800000);
                          }
                        }
                        else if (uVar22 < 0xf800000) {
                          fVar25 = (float)(((uint)fVar25 | uVar22) + 0x38000000);
                        }
                        else {
                          fVar25 = (float)((uint)fVar25 | uVar22 | 0x7f800000);
                        }
                        *pfVar14 = fVar25;
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        *(ushort *)pfVar14 = *(ushort *)((long)pvVar17 + lVar21 * 2);
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  else {
                    if (uVar2 != 0) goto LAB_001270b3;
                    if (0 < iVar20) {
                      lVar21 = 0;
                      do {
                        uVar23 = *(ushort *)((long)pvVar17 + lVar21 * 2);
                        uVar16 = (uint)uVar23;
                        if ((short)uVar23 < 0) {
                          fVar25 = 0.0;
                        }
                        else if ((~uVar16 & 0x7c00) == 0) {
                          fVar25 = (float)-(uint)((uVar23 & 0x3ff) == 0);
                        }
                        else {
                          uVar24 = uVar16 * 0x2000;
                          if (uVar16 < 0x400) {
                            if (uVar23 == 0) {
                              fVar25 = 0.0;
                            }
                            else {
                              uVar22 = 0x1f;
                              if (uVar16 != 0) {
                                for (; uVar24 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                                }
                              }
                              iVar10 = (uVar22 ^ 0x1f) - 8;
                              fVar25 = (float)((uVar24 << ((byte)iVar10 & 0x1f) | 0x38800000) +
                                              iVar10 * -0x800000);
                            }
                          }
                          else if (uVar16 < 0x7c00) {
                            fVar25 = (float)(uVar24 + 0x38000000);
                          }
                          else {
                            fVar25 = (float)(uVar24 | 0x7f800000);
                          }
                          fVar25 = (float)(long)fVar25;
                        }
                        *pfVar14 = fVar25;
                        pfVar14 = (float *)((long)pfVar14 + lVar9);
                        lVar21 = lVar21 + 1;
                      } while (iVar20 != (int)lVar21);
                    }
                  }
                  goto LAB_00127388;
                }
LAB_001270b3:
                bVar6 = false;
              }
              if (!bVar6) {
                iVar7 = 1;
                goto LAB_00127421;
              }
              puVar11 = puVar11 + ((long)iVar7 & 0xfffffffffffffff8);
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar3);
            iVar7 = 0;
          }
LAB_00127421:
          if ((iVar7 != 7) && (iVar7 != 0)) break;
          lVar13 = lVar13 + 1;
          bVar18 = lVar13 < decode->channel_count;
        } while (lVar13 < decode->channel_count);
      }
      if (bVar18) {
        return 3;
      }
      piVar15 = piVar15 + (int)uVar3;
      local_78 = local_78 + 1;
    } while (local_78 != lVar8);
  }
  return 0;
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (!pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = (uint8_t*) outpix;
                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += bpc * samps;
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}